

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-similarities.cc
# Opt level: O3

void __thiscall
dynet::DotProduct::backward_dev_impl<dynet::Device_CPU>
          (DotProduct *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  type local_c0;
  type local_b0;
  float *local_98;
  _Type local_90;
  float *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  
  uVar7 = (fx->d).bd;
  ppTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = ppTVar1[i];
  uVar4 = (ulong)(pTVar2->d).nd;
  if (uVar7 == 1) {
    iVar5 = 1;
    iVar3 = 1;
    if (uVar4 != 0) {
      uVar9 = 0;
      do {
        iVar3 = iVar3 * (pTVar2->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    pTVar2 = ppTVar1[1 - i];
    uVar4 = (ulong)(pTVar2->d).nd;
    if (uVar4 != 0) {
      iVar5 = 1;
      uVar9 = 0;
      do {
        iVar5 = iVar5 * (pTVar2->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    local_80 = (float *)(ulong)(iVar5 * (pTVar2->d).bd);
    uVar4 = (ulong)(dEdf->d).nd;
    iVar11 = 1;
    iVar5 = 1;
    if (uVar4 != 0) {
      iVar5 = 1;
      uVar9 = 0;
      do {
        iVar5 = iVar5 * (dEdf->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    local_88 = pTVar2->v;
    local_70 = (float *)(ulong)(iVar5 * (dEdf->d).bd);
    local_78 = dEdf->v;
    local_c0.m_data = dEdxi->v;
    uVar4 = (ulong)(dEdxi->d).nd;
    if (uVar4 != 0) {
      iVar11 = 1;
      uVar9 = 0;
      do {
        iVar11 = iVar11 * (dEdxi->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    local_c0.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar11 * (dEdxi->d).bd;
    local_c0.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
    local_b0.m_data = (StoragePointerType)&local_c0;
    local_b0.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_98;
    local_68 = (float *)CONCAT44(local_68._4_4_,iVar3);
    local_98 = local_c0.m_data;
    local_90[0] = (long)local_c0.m_dimensions.super_array<long,_1>._M_elems[0];
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
           *)&local_b0,dev->edevice);
  }
  else {
    if (uVar4 == 0) {
      uVar4 = 0x100000001;
    }
    else {
      uVar6 = 1;
      uVar9 = 0;
      do {
        uVar6 = uVar6 * (pTVar2->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
      uVar4 = (ulong)uVar6 | 0x100000000;
    }
    if (((*ppTVar1)->d).bd == (ppTVar1[1]->d).bd) {
      uVar7 = 1;
      pTVar2 = ppTVar1[1 - i];
      uVar9 = (ulong)(pTVar2->d).nd;
      local_60 = (float *)0x1;
      local_78 = (float *)0x1;
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          uVar7 = uVar7 * (pTVar2->d).d[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        local_78 = (float *)(ulong)uVar7;
      }
      local_70 = (float *)(ulong)(pTVar2->d).bd;
      uVar9 = (ulong)(dEdf->d).nd;
      if (uVar9 != 0) {
        uVar7 = 1;
        uVar10 = 0;
        do {
          uVar7 = uVar7 * (dEdf->d).d[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        local_60 = (float *)(ulong)uVar7;
      }
      local_80 = pTVar2->v;
      local_68 = dEdf->v;
      local_58 = (ulong)(dEdf->d).bd;
      local_b0.m_data = dEdxi->v;
      uVar9 = (ulong)(dEdxi->d).nd;
      if (uVar9 == 0) {
        local_b0.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
      }
      else {
        uVar7 = 1;
        uVar10 = 0;
        do {
          uVar7 = uVar7 * (dEdxi->d).d[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        local_b0.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar7;
      }
      local_b0.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
      local_c0.m_data = (StoragePointerType)&local_b0;
      local_c0.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_98;
      local_98 = local_b0.m_data;
      local_90[0] = local_b0.m_dimensions.super_array<long,_2>._M_elems[0];
      local_88 = (float *)local_b0.m_dimensions.super_array<long,_2>._M_elems[1];
      local_50 = uVar4;
      Eigen::internal::
      TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
      ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
             *)&local_c0,dev->edevice);
    }
    else {
      local_b0.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
      pTVar2 = ppTVar1[1 - i];
      local_80 = pTVar2->v;
      uVar9 = (ulong)(pTVar2->d).nd;
      if (local_b0.m_dimensions.super_array<long,_2>._M_elems[1] == 1) {
        local_68 = (float *)0x1;
        uVar10 = 1;
        if (uVar9 != 0) {
          uVar7 = 1;
          uVar10 = 0;
          do {
            uVar7 = uVar7 * (pTVar2->d).d[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
          uVar10 = (ulong)uVar7;
        }
        local_78 = (float *)(ulong)(pTVar2->d).bd;
        uVar9 = (ulong)(dEdf->d).nd;
        if (uVar9 != 0) {
          uVar7 = 1;
          uVar8 = 0;
          do {
            uVar7 = uVar7 * (dEdf->d).d[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
          local_68 = (float *)(ulong)uVar7;
        }
        local_70 = dEdf->v;
        local_60 = (float *)(ulong)(dEdf->d).bd;
        local_c0.m_data = dEdxi->v;
        uVar9 = (ulong)(dEdxi->d).nd;
        if (uVar9 == 0) {
          local_c0.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)(_Type)0x1;
        }
        else {
          uVar7 = 1;
          uVar8 = 0;
          do {
            uVar7 = uVar7 * (dEdxi->d).d[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
          local_c0.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
          local_c0.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = uVar7;
        }
        local_b0.m_data = (StoragePointerType)&local_c0;
        local_b0.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_98;
        local_48 = CONCAT44(local_48._4_4_,1);
        local_98 = local_c0.m_data;
        local_90[0] = (long)local_c0.m_dimensions.super_array<long,_1>._M_elems[0];
        local_88 = local_80;
        local_80 = (float *)uVar10;
        local_58 = uVar4;
        Eigen::internal::
        TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
        ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>_>_>
               *)&local_b0,dev->edevice);
      }
      else {
        local_58 = 1;
        local_78 = (float *)0x1;
        if (uVar9 != 0) {
          uVar6 = 1;
          uVar10 = 0;
          do {
            uVar6 = uVar6 * (pTVar2->d).d[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
          local_78 = (float *)(ulong)uVar6;
        }
        local_70 = (float *)(ulong)(pTVar2->d).bd;
        uVar9 = (ulong)(dEdf->d).nd;
        if (uVar9 != 0) {
          uVar6 = 1;
          uVar10 = 0;
          do {
            uVar6 = uVar6 * (dEdf->d).d[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
          local_58 = (ulong)uVar6;
        }
        local_68 = (float *)(((ulong)uVar7 << 0x20) + 1);
        local_60 = dEdf->v;
        local_50 = (ulong)(dEdf->d).bd;
        local_b0.m_data = dEdxi->v;
        uVar9 = (ulong)(dEdxi->d).nd;
        if (uVar9 == 0) {
          local_b0.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
        }
        else {
          uVar7 = 1;
          uVar10 = 0;
          do {
            uVar7 = uVar7 * (dEdxi->d).d[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
          local_b0.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar7;
        }
        local_c0.m_data = (StoragePointerType)&local_b0;
        local_c0.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_98;
        local_98 = local_b0.m_data;
        local_90[0] = local_b0.m_dimensions.super_array<long,_2>._M_elems[0];
        local_88 = (float *)local_b0.m_dimensions.super_array<long,_2>._M_elems[1];
        local_48 = uVar4;
        Eigen::internal::
        TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
        ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
               *)&local_c0,dev->edevice);
      }
    }
  }
  return;
}

Assistant:

void DotProduct::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  if(fx.d.bd == 1) {
    Eigen::array<int, 1> bcast; bcast[0] = xs[i]->d.batch_size();
    dEdxi.tvec().device(*dev.edevice) += xs[1-i]->tvec() * dEdf.tvec().broadcast(bcast);
  } else {
    Eigen::array<int, 2> bcast; bcast[0] =xs[i]->d.batch_size(); bcast[1] = 1;
    if(xs[0]->d.bd == xs[1]->d.bd) {
      dEdxi.tbvec().device(*dev.edevice) += xs[1-i]->tbvec() * dEdf.tbvec().broadcast(bcast);
    } else if(dEdxi.d.bd == 1) {
      Eigen::array<int, 1> red_axis; red_axis[0] = 1;
      dEdxi.tvec().device(*dev.edevice) += (xs[1-i]->tbvec() * dEdf.tbvec().broadcast(bcast)).sum(red_axis);
    } else {
      Eigen::array<int, 2> batchcast; batchcast[0] = 1; batchcast[1] = fx.d.bd;
      dEdxi.tbvec().device(*dev.edevice) += (xs[1-i]->tbvec().broadcast(batchcast) * dEdf.tbvec().broadcast(bcast));
    }
  }
}